

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRunStats::TestRunStats
          (TestRunStats *this,TestRunInfo *_runInfo,Totals *_totals,bool _aborting)

{
  bool _aborting_local;
  Totals *_totals_local;
  TestRunInfo *_runInfo_local;
  TestRunStats *this_local;
  
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_00422fe0;
  TestRunInfo::TestRunInfo(&this->runInfo,_runInfo);
  memcpy(&this->totals,_totals,0x38);
  this->aborting = _aborting;
  return;
}

Assistant:

TestRunStats::TestRunStats(   TestRunInfo const& _runInfo,
                    Totals const& _totals,
                    bool _aborting )
    :   runInfo( _runInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}